

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
gmlc::utilities::base64_decode
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          utilities *this,string_view encoded_string,size_t offset)

{
  pointer *ppuVar1;
  utilities uVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  iterator iVar7;
  byte bVar8;
  ulong in_RAX;
  long lVar9;
  utilities *puVar10;
  uint uVar11;
  uchar *__args;
  uint uVar12;
  utilities *puVar13;
  ulong uVar14;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  undefined8 local_38;
  
  puVar10 = this + ~(ulong)encoded_string._M_str;
  local_38 = in_RAX & 0xff00000000000000;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(ulong)((long)puVar10 * 4) / 3 + 2);
  if (puVar10 == (utilities *)0x0) {
    uVar11 = 0;
  }
  else {
    puVar13 = (utilities *)0x0;
    uVar11 = 0;
    do {
      uVar2 = puVar13[encoded_string._M_len + (long)(int)encoded_string._M_str];
      if (((ulong)(byte)uVar2 == 0x3d) ||
         (*(char *)((long)&std::__ioinit + (ulong)(byte)uVar2 + 1) == -1)) break;
      lVar9 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      *(utilities *)((long)&local_38 + lVar9) = uVar2;
      uVar14 = local_38;
      if (uVar11 == 4) {
        cVar3 = *(char *)((long)&std::__ioinit + (local_38 & 0xff) + 1);
        bVar4 = *(byte *)((long)&std::__ioinit + (local_38 >> 8 & 0xff) + 1);
        local_38._0_2_ = CONCAT11(bVar4,cVar3);
        bVar5 = *(byte *)((long)&std::__ioinit + (uVar14 >> 0x10 & 0xff) + 1);
        local_38._0_3_ = CONCAT12(bVar5,(undefined2)local_38);
        cVar6 = *(char *)((long)&std::__ioinit + (uVar14 >> 0x18 & 0xff) + 1);
        local_38._0_4_ = CONCAT13(cVar6,(undefined3)local_38);
        bVar8 = bVar4 >> 4 & 3 | cVar3 << 2;
        local_38._0_5_ = CONCAT14(bVar8,(undefined4)local_38);
        local_38._0_6_ = CONCAT15(bVar5 >> 2 & 0xf | bVar4 << 4,(undefined5)local_38);
        local_38._7_1_ = SUB81(uVar14,7);
        local_38._0_7_ = CONCAT16(bVar5 * '@' + cVar6,(undefined6)local_38);
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar7,(uchar *)((long)&local_38 + 4));
        }
        else {
          *iVar7._M_current = bVar8;
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar7,(uchar *)((long)&local_38 + 5));
        }
        else {
          *iVar7._M_current = local_38._5_1_;
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uVar11 = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar7,(uchar *)((long)&local_38 + 6));
        }
        else {
          *iVar7._M_current = local_38._6_1_;
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
          uVar11 = 0;
        }
      }
      puVar13 = puVar13 + 1;
    } while (puVar10 != puVar13);
  }
  if (0 < (int)uVar11) {
    if ((int)uVar11 < 4) {
      memset((void *)((long)&local_38 + (ulong)uVar11),0,(ulong)(3 - uVar11) + 1);
    }
    uVar14 = local_38;
    cVar3 = *(char *)((long)&std::__ioinit + (local_38 & 0xff) + 1);
    bVar4 = *(byte *)((long)&std::__ioinit + (local_38 >> 8 & 0xff) + 1);
    local_38._0_2_ = CONCAT11(bVar4,cVar3);
    bVar5 = *(byte *)((long)&std::__ioinit + (uVar14 >> 0x10 & 0xff) + 1);
    local_38._0_3_ = CONCAT12(bVar5,(undefined2)local_38);
    cVar6 = *(char *)((long)&std::__ioinit + (uVar14 >> 0x18 & 0xff) + 1);
    local_38._0_4_ = CONCAT13(cVar6,(undefined3)local_38);
    local_38._0_5_ = CONCAT14(bVar4 >> 4 & 3 | cVar3 << 2,(undefined4)local_38);
    local_38._0_6_ = CONCAT15(bVar5 >> 2 & 0xf | bVar4 << 4,(undefined5)local_38);
    local_38._7_1_ = SUB81(uVar14,7);
    local_38._0_7_ = CONCAT16(bVar5 * '@' + cVar6,(undefined6)local_38);
    if (uVar11 != 1) {
      uVar12 = 2;
      if (2 < (int)uVar11) {
        uVar12 = uVar11;
      }
      uVar14 = (ulong)(uVar12 - 1);
      __args = (uchar *)((long)&local_38 + 4);
      do {
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar7,__args);
        }
        else {
          *iVar7._M_current = *__args;
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        __args = __args + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    base64_decode(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size() - offset - 1;
    int indexOut = 0;
    int indexIn = static_cast<int>(offset);
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::vector<unsigned char> ret;
    ret.reserve((in_len * 4) / 3 + 2);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}